

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::MidiFile(MidiFile *this,string *filename)

{
  MidiEventList *this_00;
  reference ppMVar1;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int local_28;
  int i;
  string *filename_local;
  MidiFile *this_local;
  
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::vector(&this->m_events);
  this->m_ticksPerQuarterNote = 0x78;
  this->m_trackCount = 1;
  this->m_theTrackState = 0;
  this->m_theTimeState = 1;
  std::__cxx11::string::string((string *)&this->m_readFileName);
  this->m_timemapvalid = false;
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::vector(&this->m_timemap);
  this->m_rwstatus = true;
  this->m_linkedEventsQ = false;
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,(long)this->m_trackCount);
  __buf = extraout_RDX;
  for (local_28 = 0; local_28 < this->m_trackCount; local_28 = local_28 + 1) {
    this_00 = (MidiEventList *)operator_new(0x18);
    MidiEventList::MidiEventList(this_00);
    ppMVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)local_28);
    *ppMVar1 = this_00;
    __buf = extraout_RDX_00;
  }
  read(this,(int)filename,__buf,(size_t)this);
  return;
}

Assistant:

MidiFile::MidiFile(const std::string& filename) {
	m_events.resize(m_trackCount);
	for (int i=0; i<m_trackCount; i++) {
		m_events[i] = new MidiEventList;
	}
	read(filename);
}